

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall
MT32Emu::RendererImpl<float>::produceLA32Output
          (RendererImpl<float> *this,FloatSample *buffer,Bit32u len)

{
  DACInputMode DVar1;
  long lVar2;
  FloatSample FVar3;
  
  DVar1 = ((this->super_Renderer).synth)->dacInputMode;
  if (DVar1 == DACInputMode_NICE) {
    if (len != 0) {
      lVar2 = 0;
      do {
        buffer[lVar2] = buffer[lVar2] + buffer[lVar2];
        lVar2 = lVar2 + 1;
      } while (len != (Bit32u)lVar2);
    }
  }
  else if ((DVar1 == DACInputMode_GENERATION2) && (len != 0)) {
    lVar2 = 0;
    do {
      FVar3 = buffer[lVar2] + buffer[lVar2];
      if (-1.0 <= FVar3) {
        if (1.0 < FVar3) {
          FVar3 = FVar3 + -2.0;
        }
      }
      else {
        FVar3 = FVar3 + 2.0;
      }
      buffer[lVar2] = FVar3;
      lVar2 = lVar2 + 1;
    } while (len != (Bit32u)lVar2);
  }
  return;
}

Assistant:

void RendererImpl<FloatSample>::produceLA32Output(FloatSample *buffer, Bit32u len) {
	switch (synth.getDACInputMode()) {
	case DACInputMode_NICE:
		// Note, we do not do any clamping for floats here to avoid introducing distortions.
		// This means that the output signal may actually overshoot the unity when the volume is set too high.
		// We leave it up to the consumer whether the output is to be clamped or properly normalised further on.
		while (len--) {
			*buffer *= 2.0f;
			buffer++;
		}
		break;
	case DACInputMode_GENERATION2:
		while (len--) {
			*buffer = produceDistortedSample(2.0f * *buffer);
			buffer++;
		}
		break;
	default:
		break;
	}
}